

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SteepestDescent.cpp
# Opt level: O2

DynamicVector<double,_std::allocator<double>_> * __thiscall
QuantLib::SteepestDescent::getUpdatedDirection
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,
          SteepestDescent *this,Problem *param_1,RealType param_2,
          DynamicVector<double,_std::allocator<double>_> *param_3)

{
  OpenMD::operator-(__return_storage_ptr__,
                    (OpenMD *)&((this->super_LineSearchBasedMethod).lineSearch_)->gradient_,
                    (DynamicVector<double,_std::allocator<double>_> *)param_1);
  return __return_storage_ptr__;
}

Assistant:

DynamicVector<RealType> SteepestDescent::getUpdatedDirection(
      const Problem&, RealType, const DynamicVector<RealType>&) {
    return -lineSearch_->lastGradient();
  }